

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::BusySpinStrategy::SignalAlertWaitingOnDependents::test_method
          (SignalAlertWaitingOnDependents *this)

{
  undefined8 uVar1;
  bool bVar2;
  Sequence *in_RDI;
  thread waiter;
  atomic<long> return_value;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  basic_cstring<const_char> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  memory_order in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  thread *in_stack_fffffffffffffd40;
  undefined8 local_230;
  basic_cstring<const_char> local_228;
  undefined1 local_218 [40];
  undefined1 local_1f0 [16];
  basic_cstring<const_char> local_1e0;
  undefined8 local_1d0;
  basic_cstring<const_char> local_1c8;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  basic_cstring<const_char> local_180;
  int64_t local_170;
  undefined8 local_168;
  basic_cstring<const_char> local_160;
  undefined1 local_150 [40];
  undefined1 local_128 [16];
  basic_cstring<const_char> local_118;
  int64_t local_108;
  undefined8 local_100;
  basic_cstring<const_char> local_f8;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  basic_cstring<const_char> local_b0 [2];
  int64_t local_90 [2];
  undefined8 *local_80;
  undefined8 local_70 [2];
  undefined8 local_60;
  memory_order local_58;
  undefined4 local_54;
  undefined8 *local_50;
  undefined8 local_48;
  memory_order local_40;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 local_30;
  memory_order local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined8 local_18;
  memory_order local_10;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_70[0] = 0xffffffffffffffff;
  local_80 = local_70;
  std::thread::
  thread<disruptor::test::BusySpinStrategy::SignalAlertWaitingOnDependents::test_method()::__0,,void>
            (in_stack_fffffffffffffd40,
             (type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  local_90[0] = 1;
  Sequence::IncrementAndGet(in_RDI,local_90);
  disruptor::BusySpinStrategy::SignalAllWhenBlocking((BusySpinStrategy *)(in_RDI[4].padding0_ + 3));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_b0,0x84,local_c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_8 = local_70;
    local_c = 5;
    local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_18 = local_70[0];
    local_100 = local_70[0];
    in_stack_fffffffffffffd18 = "kInitialCursorValue";
    in_stack_fffffffffffffd10 = (basic_cstring<const_char> *)&kInitialCursorValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e8,&local_f8,0x84,1,2,&local_100,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1187fc);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_108 = 1;
  Sequence::IncrementAndGet(in_RDI + 1,&local_108);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_118,0x87,local_128);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_20 = local_70;
    local_24 = 5;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_30 = local_70[0];
    local_168 = local_70[0];
    in_stack_fffffffffffffd18 = "kInitialCursorValue";
    in_stack_fffffffffffffd10 = (basic_cstring<const_char> *)&kInitialCursorValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_150,&local_160,0x87,1,2,&local_168,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1189f1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_170 = 1;
  Sequence::IncrementAndGet(in_RDI + 2,&local_170);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_180,0x8a,local_190);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_38 = local_70;
    local_3c = 5;
    local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_48 = local_70[0];
    local_1d0 = local_70[0];
    in_stack_fffffffffffffd18 = "kInitialCursorValue";
    in_stack_fffffffffffffd10 = (basic_cstring<const_char> *)&kInitialCursorValue;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1b8,&local_1c8,0x8a,1,2,&local_1d0,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x118bd1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::atomic<bool>::store
            ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (bool)in_stack_fffffffffffffd27,in_stack_fffffffffffffd20);
  std::thread::join();
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e0,0x8f,local_1f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
               ,0x6b);
    local_50 = local_70;
    local_54 = 5;
    local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_60 = local_70[0];
    local_230 = local_70[0];
    in_stack_fffffffffffffd18 = "kAlertedSignal";
    in_stack_fffffffffffffd10 = (basic_cstring<const_char> *)&kAlertedSignal;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_218,&local_228,0x8f,1,2,&local_230,"return_value.load()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x118db4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::thread::~thread((thread *)0x118dda);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalAlertWaitingOnDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  alerted.store(true);

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kAlertedSignal);
}